

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QHybrid.cpp
# Opt level: O2

void __thiscall QHybrid::Initialize(QHybrid *this)

{
  long lVar1;
  long *plVar2;
  ulong uVar3;
  PlanningUnitMADPDiscrete *pPVar4;
  size_t sVar5;
  size_t sVar6;
  size_type size2;
  ostream *poVar7;
  E *this_00;
  Index t;
  Index ts;
  ulong uVar8;
  long lVar9;
  size_type size1;
  Index aI;
  Index agentI;
  string local_50 [32];
  
  if (this->_m_QlastTimeSteps == (QFunctionJointBeliefInterface *)0x0) {
    this_00 = (E *)__cxa_allocate_exception(0x28);
    E::E(this_00,"QHybrid::Initialize QlastTimeSteps should be valid");
  }
  else {
    if (this->_m_QheurTypeFirstTS - eQPOMDP < 2) {
      size1 = 0;
      uVar8 = 0;
      while (ts = (Index)uVar8, uVar8 < this->_m_horizonFirstTimeSteps) {
        uVar8 = 0;
        lVar9 = 1;
        while( true ) {
          agentI = (Index)uVar8;
          lVar1 = *(long *)((long)this->super_QFunctionJAOHInterface + -0x88);
          plVar2 = (long *)(**(code **)(*(long *)(&(this->super_QFunctionJAOHInterface).field_0x0 +
                                                 lVar1) + 0x60))
                                     (&(this->super_QFunctionJAOHInterface).field_0x0 + lVar1);
          uVar3 = (**(code **)(*plVar2 + 0x30))(plVar2);
          if (uVar3 <= uVar8) break;
          lVar1 = *(long *)((long)this->super_QFunctionJAOHInterface + -0x88);
          pPVar4 = (PlanningUnitMADPDiscrete *)
                   (**(code **)(*(long *)(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar1) +
                               0x60))(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar1);
          sVar5 = PlanningUnitMADPDiscrete::GetNrObservationHistories(pPVar4,agentI,ts);
          lVar1 = *(long *)((long)this->super_QFunctionJAOHInterface + -0x88);
          pPVar4 = (PlanningUnitMADPDiscrete *)
                   (**(code **)(*(long *)(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar1) +
                               0x60))(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar1);
          sVar6 = PlanningUnitMADPDiscrete::GetNrActionHistories(pPVar4,agentI,ts);
          uVar8 = (ulong)(agentI + 1);
          lVar9 = sVar5 * lVar9 * sVar6;
        }
        size1 = size1 + lVar9;
        uVar8 = (ulong)(ts + 1);
      }
      this->_m_nrJAOHinFirstTS = size1;
      lVar9 = *(long *)((long)this->super_QFunctionJAOHInterface + -0x88);
      lVar9 = (**(code **)(*(long *)(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar9) + 0x60
                          ))(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar9);
      size2 = (**(code **)(**(long **)(lVar9 + 0x30) + 0x68))();
      boost::numeric::ublas::
      matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
      ::resize(&(this->_m_QValuesFirstTimeSteps).super_matrix_t,size1,size2,false);
      QTable::SetToZero(&this->_m_QValuesFirstTimeSteps);
      this->_m_initialized = true;
      (**(code **)((long)this->super_QFunctionJAOHInterface + 0x48))(local_50,this);
      poVar7 = std::operator<<((ostream *)&std::cout,local_50);
      poVar7 = std::operator<<(poVar7," with ");
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      poVar7 = std::operator<<(poVar7," JAOH in tree (");
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::operator<<(poVar7," ts), and");
      std::__cxx11::string::~string(local_50);
      poVar7 = std::operator<<((ostream *)&std::cout," vectors for ");
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      poVar7 = std::operator<<(poVar7," ts.");
      std::endl<char,std::char_traits<char>>(poVar7);
      return;
    }
    this_00 = (E *)__cxa_allocate_exception(0x28);
    E::E(this_00,"QHybrid can only use QBG or QPOMDP for the first time steps");
  }
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

void QHybrid::Initialize()
{
#if 1 // now we can handle this case -> not working completely yet...
    if(!_m_QlastTimeSteps)
        throw(E("QHybrid::Initialize QlastTimeSteps should be valid"));
#endif

    if(!(_m_QheurTypeFirstTS==eQBG || _m_QheurTypeFirstTS==eQPOMDP))
        throw(E("QHybrid can only use QBG or QPOMDP for the first time steps"));

    // first we need to compute for how many JAOHs we will store Qvalues
    size_t nr=0;
    for(Index t=0; t<_m_horizonFirstTimeSteps ;++t)
    {
        size_t nrT=1; //the number of histories at 
        for (Index aI=0 ; aI<GetPU()->GetNrAgents(); ++aI)
        {
            size_t historiesThisAgent =  
                GetPU()->GetNrObservationHistories(aI,t) *  
                GetPU()->GetNrActionHistories(aI,t);
            nrT *= historiesThisAgent;
        }
        nr += nrT;
    }
    _m_nrJAOHinFirstTS=nr;

    _m_QValuesFirstTimeSteps.resize(_m_nrJAOHinFirstTS,
                                    GetPU()->GetNrJointActions(),
                                    false);
    _m_QValuesFirstTimeSteps.SetToZero();
    _m_initialized = true;
 
    cout << SoftPrintBrief() << " with " << _m_nrJAOHinFirstTS << " JAOH in tree ("
         << _m_horizonFirstTimeSteps << " ts), and";
    cout << " vectors for " << _m_horizonLastTimeSteps << " ts."
         << endl; 
}